

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

bool QtPrivate::QEqualityOperatorForType<QList<QKeyCombination>,_true>::equals
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  lVar1 = *(long *)((long)a + 0x10);
  if (lVar1 != *(long *)((long)b + 0x10)) {
    return false;
  }
  bVar3 = true;
  if ((*(long *)((long)a + 8) != *(long *)((long)b + 8)) && (lVar1 != 0)) {
    lVar2 = 0;
    do {
      bVar3 = *(int *)(*(long *)((long)a + 8) + lVar2) == *(int *)(*(long *)((long)b + 8) + lVar2);
      if (!bVar3) {
        return bVar3;
      }
      bVar4 = lVar1 * 4 + -4 != lVar2;
      lVar2 = lVar2 + 4;
    } while (bVar4);
  }
  return bVar3;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }